

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive3_test.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* re2::InterestingUTF8_abi_cxx11_(void)

{
  undefined8 in_RAX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX_01;
  int i;
  int iVar2;
  int j;
  int iVar3;
  int i_1;
  _Alloc_hider local_48;
  Rune in_stack_ffffffffffffffc4;
  char local_38 [16];
  
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT71((int7)((ulong)in_RAX >> 8),InterestingUTF8[abi:cxx11]()::v_abi_cxx11_);
  if (InterestingUTF8[abi:cxx11]()::v_abi_cxx11_ == '\0') {
    InterestingUTF8_abi_cxx11_();
    pvVar1 = extraout_RAX_01;
  }
  if (InterestingUTF8[abi:cxx11]()::init == '\0') {
    InterestingUTF8[abi:cxx11]()::init = '\x01';
    iVar2 = 1;
    do {
      UTF8_abi_cxx11_(in_stack_ffffffffffffffc4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
      if (local_48._M_p != local_38) {
        operator_delete(local_48._M_p);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x100);
    iVar2 = 0x100;
    do {
      UTF8_abi_cxx11_(in_stack_ffffffffffffffc4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
      if (local_48._M_p != local_38) {
        operator_delete(local_48._M_p);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x108);
    iVar2 = 0x200;
    do {
      iVar3 = -8;
      do {
        UTF8_abi_cxx11_(in_stack_ffffffffffffffc4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
        if (local_48._M_p != local_38) {
          operator_delete(local_48._M_p);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 8);
      iVar2 = iVar2 * 2;
    } while (iVar2 < 0x10ffff);
    iVar2 = 0x10fff7;
    do {
      UTF8_abi_cxx11_(in_stack_ffffffffffffffc4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
      pvVar1 = extraout_RAX;
      if (local_48._M_p != local_38) {
        operator_delete(local_48._M_p);
        pvVar1 = extraout_RAX_00;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x110000);
  }
  return pvVar1;
}

Assistant:

static const vector<string>& InterestingUTF8() {
  static bool init;
  static vector<string> v;

  if (init)
    return v;

  init = true;
  // All the Latin1 equivalents are interesting.
  for (int i = 1; i < 256; i++)
    v.push_back(UTF8(i));

  // After that, the codes near bit boundaries are
  // interesting, because they span byte sequence lengths.
  for (int j = 0; j < 8; j++)
    v.push_back(UTF8(256 + j));
  for (int i = 512; i < Runemax; i <<= 1)
    for (int j = -8; j < 8; j++)
      v.push_back(UTF8(i + j));

  // The codes near Runemax, including Runemax itself, are interesting.
  for (int j = -8; j <= 0; j++)
    v.push_back(UTF8(Runemax + j));

  return v;
}